

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::MILSpec::Dimension_ConstantDimension::CopyFrom
          (Dimension_ConstantDimension *this,Dimension_ConstantDimension *from)

{
  if (from != this) {
    this->size_ = 0;
    if (((this->super_MessageLite)._internal_metadata_.ptr_ & 1) != 0) {
      google::protobuf::internal::InternalMetadata::DoClear<std::__cxx11::string>
                (&(this->super_MessageLite)._internal_metadata_);
    }
    MergeFrom(this,from);
    return;
  }
  return;
}

Assistant:

void Dimension_ConstantDimension::CopyFrom(const Dimension_ConstantDimension& from) {
// @@protoc_insertion_point(class_specific_copy_from_start:CoreML.Specification.MILSpec.Dimension.ConstantDimension)
  if (&from == this) return;
  Clear();
  MergeFrom(from);
}